

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiheadattention_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::MultiHeadAttention_x86_avx::forward
          (MultiHeadAttention_x86_avx *this,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *_opt)

{
  ulong *puVar1;
  undefined8 *puVar2;
  int iVar3;
  int *piVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  size_t sVar7;
  int iVar8;
  Allocator *pAVar9;
  int iVar10;
  void *pvVar11;
  Allocator *pAVar12;
  undefined4 uVar13;
  long *plVar14;
  undefined4 uVar15;
  long *plVar16;
  ulong uVar17;
  int iVar18;
  int _w;
  int iVar19;
  uint uVar20;
  long lVar21;
  long lVar22;
  pointer pMVar23;
  void *pvVar24;
  int iVar25;
  pointer pMVar26;
  ulong uVar27;
  void *pvVar28;
  long lVar29;
  long lVar30;
  bool bVar31;
  Option opt1;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> qk_bottom_blobs;
  vector<int,_std::allocator<int>_> retqkvs;
  vector<int,_std::allocator<int>_> retqks;
  Option opt;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> qkv_bottom_blobs;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> qkv_top_blobs;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> qk_top_blobs;
  long local_380;
  value_type local_378;
  long local_328;
  long local_320;
  Mat local_318;
  long local_2d0;
  pointer local_2c8;
  MultiHeadAttention_x86_avx *local_2c0;
  Mat local_2b8;
  Mat local_268;
  void *local_218;
  undefined4 uStack_210;
  undefined4 uStack_20c;
  undefined4 local_208;
  undefined4 uStack_204;
  undefined4 local_200;
  long *local_1f8;
  undefined4 uStack_1f0;
  int iStack_1ec;
  undefined4 uStack_1e8;
  undefined4 uStack_1e4;
  undefined4 local_1e0;
  undefined8 local_1d8;
  void *local_1c8;
  undefined4 uStack_1c0;
  undefined4 uStack_1bc;
  undefined4 local_1b8;
  undefined4 uStack_1b4;
  undefined4 local_1b0;
  long *local_1a8;
  undefined4 uStack_1a0;
  int iStack_19c;
  undefined4 uStack_198;
  undefined4 uStack_194;
  undefined4 local_190;
  undefined8 local_188;
  Mat local_178;
  vector<int,_std::allocator<int>_> local_128;
  vector<int,_std::allocator<int>_> local_108;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_f0;
  undefined1 local_e8 [64];
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_a8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_90;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_78;
  int iStack_60;
  bool bStack_5c;
  bool bStack_5b;
  bool bStack_5a;
  bool bStack_59;
  Allocator *local_58;
  int iStack_50;
  bool bStack_4c;
  bool bStack_4b;
  bool bStack_4a;
  bool bStack_49;
  int iStack_48;
  bool bStack_44;
  bool bStack_43;
  bool bStack_42;
  bool bStack_41;
  bool bStack_40;
  bool bStack_3f;
  bool bStack_3e;
  bool bStack_3d;
  bool bStack_3c;
  bool bStack_3b;
  bool bStack_3a;
  bool bStack_39;
  
  pMVar26 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  lVar21 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)pMVar26;
  pMVar23 = pMVar26;
  if (lVar21 != 0x48) {
    lVar22 = 0;
    if ((this->super_MultiHeadAttention).attn_mask == 0) {
      lVar22 = 0x48;
    }
    if (lVar21 != 0x90) {
      lVar22 = 0x48;
    }
    pMVar23 = (pointer)((long)&pMVar26->data + lVar22);
  }
  local_2c8 = pMVar26;
  if ((lVar21 != 0x48) &&
     (iVar19 = (this->super_MultiHeadAttention).attn_mask, iVar19 == 0 || lVar21 != 0x90)) {
    local_2c8 = pMVar23;
    if (iVar19 == 0) {
      local_2c8 = pMVar26 + 2;
    }
    if (lVar21 != 0xd8) {
      local_2c8 = pMVar26 + 2;
    }
    if (lVar21 == 0x90) {
      local_2c8 = pMVar23;
    }
  }
  if ((this->super_MultiHeadAttention).attn_mask == 0) {
    local_178.cstep = 0;
    local_178.data = (Allocator *)0x0;
    local_178.refcount._0_4_ = 0;
    local_178.refcount._4_4_ = 0;
    local_178.elemsize._0_4_ = 0;
    local_178.elemsize._4_4_ = 0;
    local_178.elempack = 0;
    local_178.allocator = (Allocator *)0x0;
    local_178.dims = 0;
    local_178.w = 0;
    local_178.h = 0;
    local_178.d = 0;
    local_178.c = 0;
  }
  else {
    piVar4 = *(int **)((long)pMVar26 + lVar21 + -0x40);
    puVar1 = (ulong *)((long)pMVar26 + lVar21 + -0x48);
    local_178.data = (void *)*puVar1;
    uVar17 = puVar1[1];
    local_178.refcount._0_4_ = (int)uVar17;
    local_178.refcount._4_4_ = (int)(uVar17 >> 0x20);
    uVar5 = *(undefined8 *)((long)pMVar26 + lVar21 + -0x38);
    local_178.elemsize._0_4_ = (int)uVar5;
    local_178.elemsize._4_4_ = (int)((ulong)uVar5 >> 0x20);
    local_178.elempack = *(int *)((long)pMVar26 + lVar21 + -0x30);
    local_178.allocator = *(Allocator **)((long)pMVar26 + lVar21 + -0x28);
    puVar2 = (undefined8 *)((long)pMVar26 + lVar21 + -0x20);
    uVar5 = *puVar2;
    uVar6 = puVar2[1];
    local_178.dims = (int)uVar5;
    local_178.w = (int)((ulong)uVar5 >> 0x20);
    local_178.h = (int)uVar6;
    local_178.d = (int)((ulong)uVar6 >> 0x20);
    local_178.c = *(int *)((long)pMVar26 + lVar21 + -0x10);
    local_178.cstep = *(ulong *)((long)pMVar26 + lVar21 + -8);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + 1;
      UNLOCK();
    }
  }
  local_e8[0] = _opt->lightmode;
  local_e8[1] = _opt->use_shader_pack8;
  local_e8[2] = _opt->use_subgroup_ops;
  local_e8[3] = _opt->use_reserved_0;
  local_e8._4_4_ = _opt->num_threads;
  local_e8._8_8_ = _opt->blob_allocator;
  local_e8._16_8_ = _opt->workspace_allocator;
  local_e8._24_4_ = _opt->openmp_blocktime;
  local_e8[0x1c] = _opt->use_winograd_convolution;
  local_e8[0x1d] = _opt->use_sgemm_convolution;
  local_e8[0x1e] = _opt->use_int8_inference;
  local_e8[0x1f] = _opt->use_vulkan_compute;
  local_e8._32_8_ = *(undefined8 *)&_opt->use_bf16_storage;
  local_e8._40_4_ = _opt->vulkan_device_index;
  local_e8[0x2c] = _opt->use_reserved_1;
  local_e8[0x2d] = _opt->use_image_storage;
  local_e8[0x2e] = _opt->use_tensor_storage;
  local_e8[0x2f] = _opt->use_reserved_2;
  local_e8._48_4_ = _opt->flush_denormals;
  local_e8[0x34] = _opt->use_local_pool_allocator;
  local_e8[0x35] = _opt->use_shader_local_memory;
  local_e8[0x36] = _opt->use_cooperative_matrix;
  local_e8[0x37] = _opt->use_winograd23_convolution;
  local_e8[0x38] = _opt->use_winograd43_convolution;
  local_e8[0x39] = _opt->use_winograd63_convolution;
  local_e8[0x3a] = _opt->use_a53_a55_optimized_kernel;
  local_e8[0x3b] = _opt->use_fp16_uniform;
  local_e8[0x3c] = _opt->use_int8_uniform;
  local_e8[0x3d] = _opt->use_reserved_9;
  local_e8[0x3e] = _opt->use_reserved_10;
  local_e8[0x3f] = _opt->use_reserved_11;
  if ((this->super_MultiHeadAttention).int8_scale_term != 0) {
    local_e8._32_8_ = local_e8._32_8_ & 0xffffffffffffff;
  }
  local_318.cstep = 0;
  local_318.data = (Allocator *)0x0;
  local_318.refcount._0_4_ = 0;
  local_318.refcount._4_4_ = 0;
  local_318.elemsize._0_4_ = 0;
  local_318.elempack = 0;
  local_f0 = top_blobs;
  if (((this->super_MultiHeadAttention).attn_mask == 0) || (local_178.elempack == 1)) {
    piVar4 = (int *)CONCAT44(local_178.refcount._4_4_,(int)local_178.refcount);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + 1;
      UNLOCK();
    }
    local_318.data = local_178.data;
    local_318.refcount._0_4_ = (int)local_178.refcount;
    local_318.refcount._4_4_ = local_178.refcount._4_4_;
    local_318.elemsize._0_4_ = (int)local_178.elemsize;
    local_318.elemsize._4_4_ = local_178.elemsize._4_4_;
    local_318.elempack = local_178.elempack;
    local_318.allocator = local_178.allocator;
    local_318.dims = local_178.dims;
    local_318.w = local_178.w;
    local_318.h = local_178.h;
    local_318.d = local_178.d;
    local_318.c = local_178.c;
    local_318.cstep = local_178.cstep;
  }
  else {
    local_318.elemsize._4_4_ = (int)local_318.refcount;
    local_318.allocator = (Allocator *)local_318.data;
    local_318.dims = (int)local_318.refcount;
    local_318.w = local_318.refcount._4_4_;
    local_318.h = (int)local_318.elemsize;
    local_318.d = (int)local_318.refcount;
    local_318.c = local_318.elempack;
    convert_packing(&local_178,&local_318,1,(Option *)local_e8);
    iVar19 = -100;
    if (((Allocator *)local_318.data == (Allocator *)0x0) ||
       ((long)local_318.c * local_318.cstep == 0)) goto LAB_0056d4cb;
  }
  iVar18 = (this->super_MultiHeadAttention).embed_dim / (this->super_MultiHeadAttention).num_heads;
  _w = pMVar26->elempack * pMVar26->h;
  iVar25 = pMVar23->elempack;
  iVar3 = pMVar23->h;
  local_188 = 0;
  local_1c8 = (void *)0x0;
  uStack_1c0 = 0;
  uStack_1bc = 0;
  local_1b8 = 0;
  uStack_1b4 = 0;
  local_1b0 = 0;
  local_1a8 = (long *)0x0;
  uStack_1a0 = 0;
  iStack_19c = 0;
  uStack_198 = 0;
  uStack_194 = 0;
  local_190 = 0;
  iVar19 = (*this->q_gemm->_vptr_Layer[7])(this->q_gemm,pMVar26,&local_1c8,local_e8);
  if (iVar19 == 0) {
    local_1d8 = 0;
    local_218 = (void *)0x0;
    uStack_210 = 0;
    uStack_20c = 0;
    local_208 = 0;
    uStack_204 = 0;
    local_200 = 0;
    local_1f8 = (long *)0x0;
    uStack_1f0 = 0;
    iStack_1ec = 0;
    uStack_1e8 = 0;
    uStack_1e4 = 0;
    local_1e0 = 0;
    iVar19 = (*this->k_gemm->_vptr_Layer[7])(this->k_gemm,pMVar23,&local_218,local_e8);
    if (iVar19 == 0) {
      local_268.cstep = 0;
      local_268.data = (void *)0x0;
      local_268.refcount._0_4_ = 0;
      local_268.refcount._4_4_ = 0;
      local_268.elemsize._0_4_ = 0;
      local_268.elemsize._4_4_ = 0;
      local_268.elempack = 0;
      local_268.allocator = (Allocator *)0x0;
      local_268.dims = 0;
      local_268.w = 0;
      local_268.h = 0;
      local_268.d = 0;
      local_268.c = 0;
      Mat::create(&local_268,iVar25 * iVar3,(this->super_MultiHeadAttention).num_heads * _w,4,
                  (Allocator *)local_e8._8_8_);
      iVar19 = -100;
      if ((local_268.data != (void *)0x0) && ((long)local_268.c * local_268.cstep != 0)) {
        local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (int *)0x0;
        local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        std::vector<int,_std::allocator<int>_>::resize
                  (&local_108,(long)(this->super_MultiHeadAttention).num_heads);
        uVar20 = (this->super_MultiHeadAttention).num_heads;
        local_2c0 = this;
        if (0 < (int)uVar20) {
          lVar21 = (long)iVar18;
          lVar22 = 0;
          local_2d0 = 0;
          local_328 = 0;
          do {
            std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                      ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_2b8,2,
                       (allocator_type *)&local_378);
            iVar19 = iStack_19c;
            plVar16 = local_1a8;
            uVar15 = local_1b0;
            pvVar24 = local_2b8.data;
            lVar29 = (long)iStack_19c;
            lVar30 = CONCAT44(uStack_1b4,local_1b8);
            pvVar28 = (void *)(lVar22 * lVar29 * lVar30 + (long)local_1c8);
            piVar4 = *(int **)((long)local_2b8.data + 8);
            local_320 = lVar22;
            if (piVar4 != (int *)0x0) {
              LOCK();
              *piVar4 = *piVar4 + -1;
              UNLOCK();
              if (*piVar4 == 0) {
                if (*(long **)((long)local_2b8.data + 0x20) == (long *)0x0) {
                  if (*local_2b8.data != (void *)0x0) {
                    free(*local_2b8.data);
                  }
                }
                else {
                  (**(code **)(**(long **)((long)local_2b8.data + 0x20) + 0x18))();
                }
              }
            }
            iVar25 = iStack_1ec;
            plVar14 = local_1f8;
            uVar13 = local_200;
            pvVar11 = local_2b8.data;
            *(long *)pvVar24 = 0;
            *(long *)((long)pvVar24 + 8) = 0;
            *(undefined8 *)((long)pvVar24 + 0xc) = 0;
            *(undefined8 *)((long)pvVar24 + 0x14) = 0;
            *(long *)((long)pvVar24 + 0x28) = 0;
            *(long *)((long)pvVar24 + 0x30) = 0;
            *(void **)pvVar24 = pvVar28;
            *(long *)((long)pvVar24 + 8) = 0;
            *(long *)((long)pvVar24 + 0x10) = lVar30;
            *(undefined4 *)((long)pvVar24 + 0x18) = uVar15;
            *(long **)((long)pvVar24 + 0x20) = plVar16;
            *(undefined4 *)((long)pvVar24 + 0x28) = 2;
            *(int *)((long)pvVar24 + 0x2c) = iVar19;
            *(int *)((long)pvVar24 + 0x30) = iVar18;
            *(undefined4 *)((long)pvVar24 + 0x34) = 1;
            *(undefined4 *)((long)pvVar24 + 0x38) = 1;
            *(long *)((long)pvVar24 + 0x40) = lVar29 * lVar21;
            lVar30 = (long)iStack_1ec;
            lVar22 = CONCAT44(uStack_204,local_208);
            pvVar24 = (void *)(local_320 * lVar30 * lVar22 + (long)local_218);
            piVar4 = *(int **)((long)local_2b8.data + 0x50);
            if (piVar4 != (int *)0x0) {
              LOCK();
              *piVar4 = *piVar4 + -1;
              UNLOCK();
              if (*piVar4 == 0) {
                if (*(long **)((long)local_2b8.data + 0x68) == (long *)0x0) {
                  if (*(void **)((long)local_2b8.data + 0x48) != (void *)0x0) {
                    free(*(void **)((long)local_2b8.data + 0x48));
                  }
                }
                else {
                  (**(code **)(**(long **)((long)local_2b8.data + 0x68) + 0x18))();
                }
              }
            }
            *(long *)((long)pvVar11 + 0x88) = 0;
            *(undefined8 *)((long)pvVar11 + 0x54) = 0;
            *(undefined8 *)((long)pvVar11 + 0x5c) = 0;
            *(long *)((long)pvVar11 + 0x48) = 0;
            *(long *)((long)pvVar11 + 0x50) = 0;
            *(long *)((long)pvVar11 + 0x70) = 0;
            *(long *)((long)pvVar11 + 0x78) = 0;
            *(void **)((long)pvVar11 + 0x48) = pvVar24;
            *(long *)((long)pvVar11 + 0x50) = 0;
            *(long *)((long)pvVar11 + 0x58) = lVar22;
            *(undefined4 *)((long)pvVar11 + 0x60) = uVar13;
            *(long **)((long)pvVar11 + 0x68) = plVar14;
            *(undefined4 *)((long)pvVar11 + 0x70) = 2;
            *(int *)((long)pvVar11 + 0x74) = iVar25;
            *(int *)((long)pvVar11 + 0x78) = iVar18;
            *(undefined4 *)((long)pvVar11 + 0x7c) = 1;
            *(undefined4 *)((long)pvVar11 + 0x80) = 1;
            *(long *)((long)pvVar11 + 0x88) = lVar30 * lVar21;
            if ((local_2c0->super_MultiHeadAttention).attn_mask != 0) {
              if (local_318.dims == 3) {
                local_378.cstep = CONCAT44(local_318.elemsize._4_4_,(int)local_318.elemsize);
                local_378.data =
                     (void *)((long)(_func_int ***)local_318.data +
                             local_318.cstep * local_328 * local_378.cstep);
                local_378.refcount._0_4_ = 0;
                local_378.refcount._4_4_ = 0;
                local_378.d = 1;
                local_378.c = local_318.d;
                local_378.cstep =
                     ((long)local_318.h * (long)local_318.w * local_378.cstep + 0xf &
                     0xfffffffffffffff0) / local_378.cstep;
                local_378.dims = 2;
              }
              else {
                piVar4 = (int *)CONCAT44(local_318.refcount._4_4_,(int)local_318.refcount);
                local_378.data = local_318.data;
                local_378.refcount._0_4_ = (int)local_318.refcount;
                local_378.refcount._4_4_ = local_318.refcount._4_4_;
                local_378.dims = local_318.dims;
                local_378.d = local_318.d;
                local_378.c = local_318.c;
                local_378.cstep = local_318.cstep;
                if (piVar4 != (int *)0x0) {
                  LOCK();
                  *piVar4 = *piVar4 + 1;
                  UNLOCK();
                }
              }
              local_378.h = local_318.h;
              local_378.w = local_318.w;
              local_378.allocator = local_318.allocator;
              local_378.elempack = local_318.elempack;
              local_378.elemsize._4_4_ = local_318.elemsize._4_4_;
              local_378.elemsize._0_4_ = (int)local_318.elemsize;
              std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::push_back
                        ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_2b8,&local_378);
              piVar4 = (int *)CONCAT44(local_378.refcount._4_4_,(int)local_378.refcount);
              if (piVar4 != (int *)0x0) {
                LOCK();
                *piVar4 = *piVar4 + -1;
                UNLOCK();
                if (*piVar4 == 0) {
                  if (local_378.allocator == (Allocator *)0x0) {
                    if ((Allocator *)local_378.data != (Allocator *)0x0) {
                      free(local_378.data);
                    }
                  }
                  else {
                    (*(local_378.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              local_378.cstep = 0;
              local_378.data = (void *)0x0;
              local_378.refcount._0_4_ = 0;
              local_378.refcount._4_4_ = 0;
              local_378.elemsize._0_4_ = 0;
              local_378.elemsize._4_4_ = 0;
              local_378.elempack = 0;
              local_378.dims = 0;
              local_378.w = 0;
              local_378.h = 0;
              local_378.d = 0;
              local_378.c = 0;
            }
            std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                      (&local_78,1,(allocator_type *)&local_378);
            pMVar23 = local_78.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                      super__Vector_impl_data._M_start;
            iVar25 = local_268.w;
            pAVar12 = local_268.allocator;
            iVar19 = local_268.elempack;
            lVar22 = (long)local_268.w;
            sVar7 = CONCAT44(local_268.elemsize._4_4_,(undefined4)local_268.elemsize);
            pvVar24 = (void *)(local_2d0 * lVar22 * sVar7 + (long)local_268.data);
            pMVar26 = (pointer)(ulong)(uint)local_268.elempack;
            piVar4 = (local_78.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                      super__Vector_impl_data._M_start)->refcount;
            if (piVar4 != (int *)0x0) {
              LOCK();
              *piVar4 = *piVar4 + -1;
              UNLOCK();
              if (*piVar4 == 0) {
                if ((local_78.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                     super__Vector_impl_data._M_start)->allocator == (Allocator *)0x0) {
                  if ((local_78.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                       super__Vector_impl_data._M_start)->data != (void *)0x0) {
                    free((local_78.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                          .super__Vector_impl_data._M_start)->data);
                  }
                }
                else {
                  (*(local_78.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                     super__Vector_impl_data._M_start)->allocator->_vptr_Allocator[3])();
                }
              }
            }
            this = local_2c0;
            pMVar23->data = (void *)0x0;
            pMVar23->refcount = (int *)0x0;
            *(undefined8 *)((long)&pMVar23->refcount + 4) = 0;
            *(undefined8 *)((long)&pMVar23->elemsize + 4) = 0;
            pMVar23->dims = 0;
            pMVar23->w = 0;
            pMVar23->h = 0;
            pMVar23->d = 0;
            pMVar23->data = pvVar24;
            pMVar23->refcount = (int *)0x0;
            pMVar23->elemsize = sVar7;
            pMVar23->elempack = iVar19;
            pMVar23->allocator = pAVar12;
            pMVar23->dims = 2;
            pMVar23->w = iVar25;
            pMVar23->h = _w;
            pMVar23->d = 1;
            pMVar23->c = 1;
            pMVar23->cstep = lVar22 * _w;
            local_378.refcount._0_4_ = (int)local_e8._8_8_;
            local_378.refcount._4_4_ = SUB84(local_e8._8_8_,4);
            local_378.elemsize._0_4_ = (int)local_e8._16_8_;
            local_378.elemsize._4_4_ = SUB84(local_e8._16_8_,4);
            local_378.elempack = (int)local_e8._24_8_;
            local_378._28_4_ = SUB84(local_e8._24_8_,4);
            local_378.allocator = (Allocator *)local_e8._32_8_;
            local_378.dims = (int)local_e8._40_8_;
            local_378.w = SUB84(local_e8._40_8_,4);
            local_378.h = (int)local_e8._48_8_;
            local_378.d = SUB84(local_e8._48_8_,4);
            local_378.c = (int)local_e8._56_8_;
            local_378._60_4_ = SUB84(local_e8._56_8_,4);
            local_378.data = (void *)CONCAT44(1,(int)local_e8._0_8_);
            iVar19 = (*local_2c0->qk_gemm->_vptr_Layer[6])
                               (local_2c0->qk_gemm,&local_2b8,&local_78,&local_378);
            lVar22 = local_328;
            local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[local_328] = iVar19;
            std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&local_78);
            std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
                      ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_2b8);
            local_328 = lVar22 + 1;
            uVar20 = (this->super_MultiHeadAttention).num_heads;
            local_2d0 = local_2d0 + _w;
            lVar22 = local_320 + lVar21;
          } while (local_328 < (int)uVar20);
        }
        iVar25 = (int)pMVar26;
        bVar31 = 0 < (int)uVar20;
        if ((0 < (int)uVar20) &&
           (iVar25 = *local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start, iVar25 == 0)) {
          uVar17 = 1;
          do {
            uVar27 = uVar17;
            if (uVar20 == uVar27) break;
            iVar25 = local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar27];
            uVar17 = uVar27 + 1;
          } while (iVar25 == 0);
          bVar31 = uVar27 < uVar20;
        }
        iVar19 = iVar25;
        if (!bVar31) {
          piVar4 = (int *)CONCAT44(uStack_1bc,uStack_1c0);
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              if (local_1a8 == (long *)0x0) {
                if (local_1c8 != (void *)0x0) {
                  free(local_1c8);
                }
              }
              else {
                (**(code **)(*local_1a8 + 0x18))();
              }
            }
          }
          local_188 = 0;
          local_1c8 = (void *)0x0;
          uStack_1c0 = 0;
          uStack_1bc = 0;
          local_1b8 = 0;
          uStack_1b4 = 0;
          local_1b0 = 0;
          uStack_1a0 = 0;
          iStack_19c = 0;
          uStack_198 = 0;
          uStack_194 = 0;
          local_190 = 0;
          piVar4 = (int *)CONCAT44(uStack_20c,uStack_210);
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              if (local_1f8 == (long *)0x0) {
                if (local_218 != (void *)0x0) {
                  free(local_218);
                }
              }
              else {
                (**(code **)(*local_1f8 + 0x18))();
              }
            }
          }
          local_1d8 = 0;
          local_218 = (void *)0x0;
          uStack_210 = 0;
          uStack_20c = 0;
          local_208 = 0;
          uStack_204 = 0;
          local_200 = 0;
          uStack_1f0 = 0;
          iStack_1ec = 0;
          uStack_1e8 = 0;
          uStack_1e4 = 0;
          local_1e0 = 0;
          iVar19 = (*this->qk_softmax->_vptr_Layer[9])(this->qk_softmax,&local_268,local_e8);
          if (iVar19 == 0) {
            local_378.cstep = 0;
            local_378.data = (void *)0x0;
            local_378.refcount._0_4_ = 0;
            local_378.refcount._4_4_ = 0;
            local_378.elemsize._0_4_ = 0;
            local_378.elemsize._4_4_ = 0;
            local_378.elempack = 0;
            local_378.allocator = (Allocator *)0x0;
            local_378.dims = 0;
            local_378.w = 0;
            local_378.h = 0;
            local_378.d = 0;
            local_378.c = 0;
            iVar19 = (*this->v_gemm->_vptr_Layer[7])(this->v_gemm,local_2c8,&local_378,local_e8);
            if (iVar19 == 0) {
              local_2b8.cstep = 0;
              local_2b8.data = (void *)0x0;
              local_2b8.refcount._0_4_ = 0;
              local_2b8.refcount._4_4_ = 0;
              local_2b8.elemsize._0_4_ = 0;
              local_2b8.elemsize._4_4_ = 0;
              local_2b8.elempack = 0;
              local_2b8.allocator = (Allocator *)0x0;
              local_2b8.dims = 0;
              local_2b8.w = 0;
              local_2b8.h = 0;
              local_2b8.d = 0;
              local_2b8.c = 0;
              Mat::create(&local_2b8,_w,(this->super_MultiHeadAttention).num_heads * iVar18,4,
                          (Allocator *)local_e8._8_8_);
              iVar19 = -100;
              if ((local_2b8.data != (void *)0x0) && ((long)local_2b8.c * local_2b8.cstep != 0)) {
                local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start = (int *)0x0;
                local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                std::vector<int,_std::allocator<int>_>::resize
                          (&local_128,(long)(this->super_MultiHeadAttention).num_heads);
                uVar20 = (this->super_MultiHeadAttention).num_heads;
                if (0 < (int)uVar20) {
                  local_328 = (long)_w;
                  local_320 = (long)iVar18;
                  pMVar26 = (pointer)0x0;
                  local_380 = 0;
                  lVar21 = 0;
                  do {
                    local_2d0 = lVar21;
                    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                              (&local_a8,2,(allocator_type *)&local_78);
                    pMVar23 = local_a8.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                              _M_impl.super__Vector_impl_data._M_start;
                    iVar3 = local_268.w;
                    pAVar12 = local_268.allocator;
                    iVar19 = local_268.elempack;
                    lVar21 = (long)local_268.w;
                    sVar7 = CONCAT44(local_268.elemsize._4_4_,(undefined4)local_268.elemsize);
                    pvVar24 = (void *)((long)pMVar26 * lVar21 * sVar7 + (long)local_268.data);
                    piVar4 = (local_a8.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                              _M_impl.super__Vector_impl_data._M_start)->refcount;
                    local_2c8 = pMVar26;
                    if (piVar4 != (int *)0x0) {
                      LOCK();
                      *piVar4 = *piVar4 + -1;
                      UNLOCK();
                      if (*piVar4 == 0) {
                        if ((local_a8.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                             _M_impl.super__Vector_impl_data._M_start)->allocator ==
                            (Allocator *)0x0) {
                          if ((local_a8.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                               _M_impl.super__Vector_impl_data._M_start)->data != (void *)0x0) {
                            free((local_a8.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->data);
                          }
                        }
                        else {
                          (*(local_a8.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                             _M_impl.super__Vector_impl_data._M_start)->allocator->_vptr_Allocator
                            [3])();
                        }
                      }
                    }
                    pMVar26 = local_a8.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                              _M_impl.super__Vector_impl_data._M_start;
                    iVar10 = local_378.w;
                    pAVar9 = local_378.allocator;
                    iVar8 = local_378.elempack;
                    pMVar23->data = (void *)0x0;
                    pMVar23->refcount = (int *)0x0;
                    *(undefined8 *)((long)&pMVar23->refcount + 4) = 0;
                    *(undefined8 *)((long)&pMVar23->elemsize + 4) = 0;
                    pMVar23->dims = 0;
                    pMVar23->w = 0;
                    pMVar23->h = 0;
                    pMVar23->d = 0;
                    pMVar23->data = pvVar24;
                    pMVar23->refcount = (int *)0x0;
                    pMVar23->elemsize = sVar7;
                    pMVar23->elempack = iVar19;
                    pMVar23->allocator = pAVar12;
                    pMVar23->dims = 2;
                    pMVar23->w = iVar3;
                    pMVar23->h = _w;
                    pMVar23->d = 1;
                    pMVar23->c = 1;
                    pMVar23->cstep = lVar21 * local_328;
                    lVar21 = (long)local_378.w;
                    sVar7 = CONCAT44(local_378.elemsize._4_4_,(int)local_378.elemsize);
                    pvVar24 = (void *)(local_380 * lVar21 * sVar7 + (long)local_378.data);
                    piVar4 = local_a8.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                             _M_impl.super__Vector_impl_data._M_start[1].refcount;
                    if (piVar4 != (int *)0x0) {
                      LOCK();
                      *piVar4 = *piVar4 + -1;
                      UNLOCK();
                      if (*piVar4 == 0) {
                        if (local_a8.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                            _M_impl.super__Vector_impl_data._M_start[1].allocator ==
                            (Allocator *)0x0) {
                          if (local_a8.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                              _M_impl.super__Vector_impl_data._M_start[1].data != (void *)0x0) {
                            free(local_a8.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                 _M_impl.super__Vector_impl_data._M_start[1].data);
                          }
                        }
                        else {
                          (*(local_a8.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                             _M_impl.super__Vector_impl_data._M_start[1].allocator)->_vptr_Allocator
                            [3])();
                        }
                      }
                    }
                    pMVar26[1].cstep = 0;
                    *(undefined8 *)((long)&pMVar26[1].refcount + 4) = 0;
                    *(undefined8 *)((long)&pMVar26[1].elemsize + 4) = 0;
                    pMVar26[1].data = (void *)0x0;
                    pMVar26[1].refcount = (int *)0x0;
                    pMVar26[1].dims = 0;
                    pMVar26[1].w = 0;
                    pMVar26[1].h = 0;
                    pMVar26[1].d = 0;
                    pMVar26[1].data = pvVar24;
                    pMVar26[1].refcount = (int *)0x0;
                    pMVar26[1].elemsize = sVar7;
                    pMVar26[1].elempack = iVar8;
                    pMVar26[1].allocator = pAVar9;
                    pMVar26[1].dims = 2;
                    pMVar26[1].w = iVar10;
                    pMVar26[1].h = iVar18;
                    pMVar26[1].d = 1;
                    pMVar26[1].c = 1;
                    pMVar26[1].cstep = lVar21 * local_320;
                    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                              (&local_90,1,(allocator_type *)&local_78);
                    pMVar26 = local_90.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                              _M_impl.super__Vector_impl_data._M_start;
                    iVar3 = local_2b8.w;
                    pAVar12 = local_2b8.allocator;
                    iVar19 = local_2b8.elempack;
                    lVar21 = (long)local_2b8.w;
                    sVar7 = CONCAT44(local_2b8.elemsize._4_4_,(undefined4)local_2b8.elemsize);
                    pvVar24 = (void *)((long)local_2b8.data + local_380 * lVar21 * sVar7);
                    piVar4 = (local_90.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                              _M_impl.super__Vector_impl_data._M_start)->refcount;
                    if (piVar4 != (int *)0x0) {
                      LOCK();
                      *piVar4 = *piVar4 + -1;
                      UNLOCK();
                      if (*piVar4 == 0) {
                        if ((local_90.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                             _M_impl.super__Vector_impl_data._M_start)->allocator ==
                            (Allocator *)0x0) {
                          if ((local_90.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                               _M_impl.super__Vector_impl_data._M_start)->data != (void *)0x0) {
                            free((local_90.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->data);
                          }
                        }
                        else {
                          (*(local_90.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                             _M_impl.super__Vector_impl_data._M_start)->allocator->_vptr_Allocator
                            [3])();
                        }
                      }
                    }
                    this = local_2c0;
                    lVar22 = local_320;
                    pMVar26->data = (void *)0x0;
                    pMVar26->refcount = (int *)0x0;
                    *(undefined8 *)((long)&pMVar26->refcount + 4) = 0;
                    *(undefined8 *)((long)&pMVar26->elemsize + 4) = 0;
                    pMVar26->dims = 0;
                    pMVar26->w = 0;
                    pMVar26->h = 0;
                    pMVar26->d = 0;
                    pMVar26->data = pvVar24;
                    pMVar26->refcount = (int *)0x0;
                    pMVar26->elemsize = sVar7;
                    pMVar26->elempack = iVar19;
                    pMVar26->allocator = pAVar12;
                    pMVar26->dims = 2;
                    pMVar26->w = iVar3;
                    pMVar26->h = iVar18;
                    pMVar26->d = 1;
                    pMVar26->c = 1;
                    pMVar26->cstep = lVar21 * local_320;
                    local_78.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                    super__Vector_impl_data._M_finish = (pointer)local_e8._8_8_;
                    local_78.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage = (pointer)local_e8._16_8_;
                    iStack_60 = local_e8._24_4_;
                    bStack_5c = (bool)local_e8[0x1c];
                    bStack_5b = (bool)local_e8[0x1d];
                    bStack_5a = (bool)local_e8[0x1e];
                    bStack_59 = (bool)local_e8[0x1f];
                    local_58 = (Allocator *)local_e8._32_8_;
                    iStack_50 = local_e8._40_4_;
                    bStack_4c = (bool)local_e8[0x2c];
                    bStack_4b = (bool)local_e8[0x2d];
                    bStack_4a = (bool)local_e8[0x2e];
                    bStack_49 = (bool)local_e8[0x2f];
                    iStack_48 = local_e8._48_4_;
                    bStack_44 = (bool)local_e8[0x34];
                    bStack_43 = (bool)local_e8[0x35];
                    bStack_42 = (bool)local_e8[0x36];
                    bStack_41 = (bool)local_e8[0x37];
                    bStack_40 = (bool)local_e8[0x38];
                    bStack_3f = (bool)local_e8[0x39];
                    bStack_3e = (bool)local_e8[0x3a];
                    bStack_3d = (bool)local_e8[0x3b];
                    bStack_3c = (bool)local_e8[0x3c];
                    bStack_3b = (bool)local_e8[0x3d];
                    bStack_3a = (bool)local_e8[0x3e];
                    bStack_39 = (bool)local_e8[0x3f];
                    local_78.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                    super__Vector_impl_data._M_start = (pointer)CONCAT44(1,(int)local_e8._0_8_);
                    iVar19 = (*local_2c0->qkv_gemm->_vptr_Layer[6])
                                       (local_2c0->qkv_gemm,&local_a8,&local_90,&local_78);
                    lVar21 = local_2d0;
                    local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[local_2d0] = iVar19;
                    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&local_90);
                    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&local_a8);
                    lVar21 = lVar21 + 1;
                    uVar20 = (this->super_MultiHeadAttention).num_heads;
                    local_380 = local_380 + lVar22;
                    pMVar26 = (pointer)((long)&local_2c8->data + local_328);
                  } while (lVar21 < (int)uVar20);
                }
                bVar31 = 0 < (int)uVar20;
                iVar19 = iVar25;
                if ((0 < (int)uVar20) &&
                   (iVar19 = *local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start,
                   *local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start == 0)) {
                  uVar17 = 1;
                  do {
                    uVar27 = uVar17;
                    iVar19 = iVar25;
                    if (uVar20 == uVar27) break;
                    iVar19 = local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar27];
                    uVar17 = uVar27 + 1;
                  } while (iVar19 == 0);
                  bVar31 = uVar27 < uVar20;
                }
                if (!bVar31) {
                  piVar4 = (int *)CONCAT44(local_378.refcount._4_4_,(int)local_378.refcount);
                  if (piVar4 != (int *)0x0) {
                    LOCK();
                    *piVar4 = *piVar4 + -1;
                    UNLOCK();
                    if (*piVar4 == 0) {
                      if (local_378.allocator == (Allocator *)0x0) {
                        if (local_378.data != (void *)0x0) {
                          free(local_378.data);
                        }
                      }
                      else {
                        (*(local_378.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  local_378.cstep = 0;
                  local_378.data = (void *)0x0;
                  local_378.refcount._0_4_ = 0;
                  local_378.refcount._4_4_ = 0;
                  local_378.elemsize._0_4_ = 0;
                  local_378.elemsize._4_4_ = 0;
                  local_378.elempack = 0;
                  local_378.dims = 0;
                  local_378.w = 0;
                  local_378.h = 0;
                  local_378.d = 0;
                  local_378.c = 0;
                  iVar19 = (*this->o_gemm->_vptr_Layer[7])
                                     (this->o_gemm,&local_2b8,
                                      (local_f0->
                                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                      _M_impl.super__Vector_impl_data._M_start,local_e8);
                }
                if (local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start != (int *)0x0) {
                  operator_delete(local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                                  (long)local_128.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_128.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
                }
              }
              piVar4 = (int *)CONCAT44(local_2b8.refcount._4_4_,local_2b8.refcount._0_4_);
              if (piVar4 != (int *)0x0) {
                LOCK();
                *piVar4 = *piVar4 + -1;
                UNLOCK();
                if (*piVar4 == 0) {
                  if (local_2b8.allocator == (Allocator *)0x0) {
                    if (local_2b8.data != (void *)0x0) {
                      free(local_2b8.data);
                    }
                  }
                  else {
                    (*(local_2b8.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              local_2b8.cstep = 0;
              local_2b8.data = (long *)0x0;
              local_2b8.refcount._0_4_ = 0;
              local_2b8.refcount._4_4_ = 0;
              local_2b8.elemsize._0_4_ = 0;
              local_2b8.elemsize._4_4_ = 0;
              local_2b8.elempack = 0;
              local_2b8.dims = 0;
              local_2b8.w = 0;
              local_2b8.h = 0;
              local_2b8.d = 0;
              local_2b8.c = 0;
            }
            piVar4 = (int *)CONCAT44(local_378.refcount._4_4_,(int)local_378.refcount);
            if (piVar4 != (int *)0x0) {
              LOCK();
              *piVar4 = *piVar4 + -1;
              UNLOCK();
              if (*piVar4 == 0) {
                if (local_378.allocator == (Allocator *)0x0) {
                  if (local_378.data != (void *)0x0) {
                    free(local_378.data);
                  }
                }
                else {
                  (*(local_378.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            local_378.cstep = 0;
            local_378.data = (void *)0x0;
            local_378.refcount._0_4_ = 0;
            local_378.refcount._4_4_ = 0;
            local_378.elemsize._0_4_ = 0;
            local_378.elemsize._4_4_ = 0;
            local_378.elempack = 0;
            local_378.dims = 0;
            local_378.w = 0;
            local_378.h = 0;
            local_378.d = 0;
            local_378.c = 0;
          }
        }
        if (local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (int *)0x0) {
          operator_delete(local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
      }
      piVar4 = (int *)CONCAT44(local_268.refcount._4_4_,local_268.refcount._0_4_);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (local_268.allocator == (Allocator *)0x0) {
            if (local_268.data != (void *)0x0) {
              free(local_268.data);
            }
          }
          else {
            (*(local_268.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_268.cstep = 0;
      local_268.data = (void *)0x0;
      local_268.refcount._0_4_ = 0;
      local_268.refcount._4_4_ = 0;
      local_268.elemsize._0_4_ = 0;
      local_268.elemsize._4_4_ = 0;
      local_268.elempack = 0;
      local_268.dims = 0;
      local_268.w = 0;
      local_268.h = 0;
      local_268.d = 0;
      local_268.c = 0;
    }
    piVar4 = (int *)CONCAT44(uStack_20c,uStack_210);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if (local_1f8 == (long *)0x0) {
          if (local_218 != (void *)0x0) {
            free(local_218);
          }
        }
        else {
          (**(code **)(*local_1f8 + 0x18))();
        }
      }
    }
    local_1d8 = 0;
    local_218 = (void *)0x0;
    uStack_210 = 0;
    uStack_20c = 0;
    local_208 = 0;
    uStack_204 = 0;
    local_200 = 0;
    uStack_1f0 = 0;
    iStack_1ec = 0;
    uStack_1e8 = 0;
    uStack_1e4 = 0;
    local_1e0 = 0;
  }
  piVar4 = (int *)CONCAT44(uStack_1bc,uStack_1c0);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_1a8 == (long *)0x0) {
        if (local_1c8 != (void *)0x0) {
          free(local_1c8);
        }
      }
      else {
        (**(code **)(*local_1a8 + 0x18))();
      }
    }
  }
  local_188 = 0;
  local_1c8 = (void *)0x0;
  uStack_1c0 = 0;
  uStack_1bc = 0;
  local_1b8 = 0;
  uStack_1b4 = 0;
  local_1b0 = 0;
  uStack_1a0 = 0;
  iStack_19c = 0;
  uStack_198 = 0;
  uStack_194 = 0;
  local_190 = 0;
LAB_0056d4cb:
  piVar4 = (int *)CONCAT44(local_318.refcount._4_4_,(int)local_318.refcount);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_318.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_318.data != (Allocator *)0x0) {
          free(local_318.data);
        }
      }
      else {
        (*(local_318.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_318.cstep = 0;
  local_318.data = (void *)0x0;
  local_318.refcount._0_4_ = 0;
  local_318.refcount._4_4_ = 0;
  local_318.elemsize._0_4_ = 0;
  local_318.elemsize._4_4_ = 0;
  local_318.elempack = 0;
  local_318.dims = 0;
  local_318.w = 0;
  local_318.h = 0;
  local_318.d = 0;
  local_318.c = 0;
  piVar4 = (int *)CONCAT44(local_178.refcount._4_4_,(int)local_178.refcount);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_178.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_178.data != (Allocator *)0x0) {
          free(local_178.data);
        }
      }
      else {
        (*(local_178.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar19;
}

Assistant:

int MultiHeadAttention_x86_avx::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& _opt) const
{
    const Mat& q_blob = bottom_blobs[0];
    const Mat& k_blob = (bottom_blobs.size() == 1 || (bottom_blobs.size() == 2 && attn_mask)) ? q_blob : bottom_blobs[1];
    const Mat& v_blob = (bottom_blobs.size() == 1 || (bottom_blobs.size() == 2 && attn_mask)) ? q_blob : (bottom_blobs.size() == 2 || (bottom_blobs.size() == 3 && attn_mask)) ? k_blob : bottom_blobs[2];
    const Mat& attn_mask_blob = attn_mask ? bottom_blobs[bottom_blobs.size() - 1] : Mat();

    Option opt = _opt;
    if (int8_scale_term)
    {
        opt.use_packing_layout = false; // TODO enable packing
    }

    Mat attn_mask_blob_unpacked;
    if (attn_mask && attn_mask_blob.elempack != 1)
    {
        convert_packing(attn_mask_blob, attn_mask_blob_unpacked, 1, opt);
        if (attn_mask_blob_unpacked.empty())
            return -100;
    }
    else
    {
        attn_mask_blob_unpacked = attn_mask_blob;
    }

    const int embed_dim_per_head = embed_dim / num_heads;
    const int src_seqlen = q_blob.h * q_blob.elempack;
    const int dst_seqlen = k_blob.h * k_blob.elempack;

    Mat q_affine;
    int retq = q_gemm->forward(q_blob, q_affine, opt);
    if (retq != 0)
        return retq;

    Mat k_affine;
    int retk = k_gemm->forward(k_blob, k_affine, opt);
    if (retk != 0)
        return retk;

    Mat qk_cross(dst_seqlen, src_seqlen * num_heads, 4u, opt.blob_allocator);
    if (qk_cross.empty())
        return -100;

    std::vector<int> retqks;
    retqks.resize(num_heads);
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < num_heads; i++)
    {
        std::vector<Mat> qk_bottom_blobs(2);
        qk_bottom_blobs[0] = q_affine.row_range(i * embed_dim_per_head, embed_dim_per_head);
        qk_bottom_blobs[1] = k_affine.row_range(i * embed_dim_per_head, embed_dim_per_head);
        if (attn_mask)
        {
            const Mat& maskm = attn_mask_blob_unpacked.dims == 3 ? attn_mask_blob_unpacked.channel(i) : attn_mask_blob_unpacked;
            qk_bottom_blobs.push_back(maskm);
        }
        std::vector<Mat> qk_top_blobs(1);
        qk_top_blobs[0] = qk_cross.row_range(i * src_seqlen, src_seqlen);
        Option opt1 = opt;
        opt1.num_threads = 1;
        retqks[i] = qk_gemm->forward(qk_bottom_blobs, qk_top_blobs, opt1);
    }
    for (int i = 0; i < num_heads; i++)
    {
        if (retqks[i] != 0)
            return retqks[i];
    }

    q_affine.release();
    k_affine.release();

    int retqk = qk_softmax->forward_inplace(qk_cross, opt);
    if (retqk != 0)
        return retqk;

    Mat v_affine;
    int retv = v_gemm->forward(v_blob, v_affine, opt);
    if (retv != 0)
        return retv;

    Mat qkv_cross(src_seqlen, embed_dim_per_head * num_heads, 4u, opt.blob_allocator);
    if (qkv_cross.empty())
        return -100;

    std::vector<int> retqkvs;
    retqkvs.resize(num_heads);
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < num_heads; i++)
    {
        std::vector<Mat> qkv_bottom_blobs(2);
        qkv_bottom_blobs[0] = qk_cross.row_range(i * src_seqlen, src_seqlen);
        qkv_bottom_blobs[1] = v_affine.row_range(i * embed_dim_per_head, embed_dim_per_head);
        std::vector<Mat> qkv_top_blobs(1);
        qkv_top_blobs[0] = qkv_cross.row_range(i * embed_dim_per_head, embed_dim_per_head);
        Option opt1 = opt;
        opt1.num_threads = 1;
        retqkvs[i] = qkv_gemm->forward(qkv_bottom_blobs, qkv_top_blobs, opt1);
    }
    for (int i = 0; i < num_heads; i++)
    {
        if (retqkvs[i] != 0)
            return retqkvs[i];
    }

    v_affine.release();

    int reto = o_gemm->forward(qkv_cross, top_blobs[0], opt);
    if (reto != 0)
        return reto;

    return 0;
}